

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_declare(exr_context_t ctxt,int part_index,char *name,exr_attribute_type_t type,
                exr_attribute_t **outattr)

{
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    p_Var1 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->mode == '\x01') {
      eVar2 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),(exr_attribute_type_t)((ulong)p_Var1 >> 0x20),
                                (int32_t)p_Var1,
                                (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                in_stack_00000020);
      internal_exr_unlock(in_RDI);
    }
    else {
      internal_exr_unlock(in_RDI);
      eVar2 = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_declare (
    exr_context_t        ctxt,
    int                  part_index,
    const char*          name,
    exr_attribute_type_t type,
    exr_attribute_t**    outattr)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = exr_attr_list_add (
        ctxt, &(part->attributes), name, type, 0, NULL, outattr);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}